

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Material::Material
          (Material *this,uint64_t id,Element *element,Document *doc,string *name)

{
  mapped_type pLVar1;
  LayeredTexture *pLVar2;
  string *this_00;
  bool bVar3;
  int iVar4;
  Scope *pSVar5;
  Element *pEVar6;
  Token *pTVar7;
  uint64_t dest;
  reference ppCVar8;
  long lVar9;
  mapped_type *ppLVar10;
  mapped_type *ppTVar11;
  Token *t;
  mapped_type local_360;
  LayeredTexture *local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  _Self local_258;
  _Self local_250;
  string *local_248;
  string *prop_1;
  _Self local_220;
  _Self local_218;
  string *local_210;
  string *prop;
  string local_200;
  mapped_type local_1e0;
  LayeredTexture *layeredTexture;
  Texture *tex;
  string local_1c8;
  Object *local_1a8;
  Object *ob;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_168;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  char *local_130;
  char *local_128;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  undefined1 local_110 [8];
  string templateName;
  string local_e8;
  string local_c8;
  allocator local_a1;
  string local_a0;
  Element *local_80;
  Element *MultiLayer;
  string local_70;
  Element *local_50;
  Element *ShadingModel;
  Scope *local_38;
  Scope *sc;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  Material *this_local;
  
  sc = (Scope *)name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Material_0037b740;
  std::__cxx11::string::string((string *)&this->shading);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
  ::map(&this->textures);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
  ::map(&this->layeredTextures);
  pSVar5 = GetRequiredScope((Element *)doc_local);
  local_38 = pSVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"ShadingModel",(allocator *)((long)&MultiLayer + 7));
  pEVar6 = Scope::operator[](pSVar5,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&MultiLayer + 7));
  pSVar5 = local_38;
  local_50 = pEVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"MultiLayer",&local_a1);
  pEVar6 = Scope::operator[](pSVar5,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pEVar6;
  if (pEVar6 != (Element *)0x0) {
    pTVar7 = GetRequiredToken(pEVar6,0);
    iVar4 = ParseTokenAsInt(pTVar7);
    this->multilayer = iVar4 != 0;
  }
  if (local_50 == (Element *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,"shading mode not specified, assuming phong",
               (allocator *)(templateName.field_2._M_local_buf + 0xf));
    Util::DOMWarning(&local_e8,(Element *)doc_local);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)(templateName.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator=((string *)&this->shading,"phong");
  }
  else {
    pTVar7 = GetRequiredToken(local_50,0);
    ParseTokenAsString_abi_cxx11_(&local_c8,(FBX *)pTVar7,t);
    std::__cxx11::string::operator=((string *)&this->shading,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  std::__cxx11::string::string((string *)local_110);
  local_118._M_current = (char *)std::__cxx11::string::begin();
  local_120._M_current = (char *)std::__cxx11::string::end();
  local_128 = (char *)std::__cxx11::string::begin();
  local_130 = (char *)std::
                      transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                (local_118,local_120,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_128,tolower);
  bVar3 = std::operator==(&this->shading,"phong");
  if (bVar3) {
    std::__cxx11::string::operator=((string *)local_110,"Material.FbxSurfacePhong");
  }
  else {
    bVar3 = std::operator==(&this->shading,"lambert");
    if (bVar3) {
      std::__cxx11::string::operator=((string *)local_110,"Material.FbxSurfaceLambert");
    }
    else {
      std::operator+(&local_150,"shading mode not recognized: ",&this->shading);
      Util::DOMWarning(&local_150,(Element *)doc_local);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  Util::GetPropertyTable
            ((Util *)&conns,(Document *)name_local,(string *)local_110,(Element *)doc_local,local_38
             ,false);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=
            (&this->props,(shared_ptr<const_Assimp::FBX::PropertyTable> *)&conns);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr
            ((shared_ptr<const_Assimp::FBX::PropertyTable> *)&conns);
  this_00 = name_local;
  dest = Object::ID(&this->super_Object);
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2,(Document *)this_00,dest);
  local_168 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               *)&__range2;
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    *)&__range2);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             *)&__range2);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                     *)&con), bVar3) {
    ppCVar8 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    ob = (Object *)*ppCVar8;
    Connection::PropertyName_abi_cxx11_((Connection *)ob);
    lVar9 = std::__cxx11::string::length();
    if (lVar9 != 0) {
      local_1a8 = Connection::SourceObject((Connection *)ob);
      if (local_1a8 == (Object *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1c8,"failed to read source object for texture link, ignoring",
                   (allocator *)((long)&tex + 7));
        Util::DOMWarning(&local_1c8,(Element *)doc_local);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tex + 7));
      }
      else {
        if (local_1a8 == (Object *)0x0) {
          local_350 = (LayeredTexture *)0x0;
        }
        else {
          local_350 = (LayeredTexture *)
                      __dynamic_cast(local_1a8,&Object::typeinfo,&Texture::typeinfo,0);
        }
        layeredTexture = local_350;
        if (local_350 == (LayeredTexture *)0x0) {
          if (local_1a8 == (Object *)0x0) {
            local_360 = (mapped_type)0x0;
          }
          else {
            local_360 = (mapped_type)
                        __dynamic_cast(local_1a8,&Object::typeinfo,&LayeredTexture::typeinfo,0);
          }
          local_1e0 = local_360;
          if (local_360 == (mapped_type)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_200,
                       "source object for texture link is not a texture or layered texture, ignoring"
                       ,(allocator *)((long)&prop + 7));
            Util::DOMWarning(&local_200,(Element *)doc_local);
            std::__cxx11::string::~string((string *)&local_200);
            std::allocator<char>::~allocator((allocator<char> *)((long)&prop + 7));
          }
          else {
            local_210 = Connection::PropertyName_abi_cxx11_((Connection *)ob);
            local_218._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                 ::find(&this->layeredTextures,local_210);
            local_220._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                 ::end(&this->layeredTextures);
            bVar3 = std::operator!=(&local_218,&local_220);
            if (bVar3) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &prop_1,"duplicate layered texture link: ",local_210);
              Util::DOMWarning((string *)&prop_1,(Element *)doc_local);
              std::__cxx11::string::~string((string *)&prop_1);
            }
            pLVar1 = local_1e0;
            ppLVar10 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
                       ::operator[](&this->layeredTextures,local_210);
            *ppLVar10 = pLVar1;
            LayeredTexture::fillTexture(local_1e0,(Document *)name_local);
          }
        }
        else {
          local_248 = Connection::PropertyName_abi_cxx11_((Connection *)ob);
          local_250._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
               ::find(&this->textures,local_248);
          local_258._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
               ::end(&this->textures);
          bVar3 = std::operator!=(&local_250,&local_258);
          if (bVar3) {
            std::operator+(&local_278,"duplicate texture link: ",local_248);
            Util::DOMWarning(&local_278,(Element *)doc_local);
            std::__cxx11::string::~string((string *)&local_278);
          }
          pLVar2 = layeredTexture;
          ppTVar11 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
                     ::operator[](&this->textures,local_248);
          *ppTVar11 = (mapped_type)pLVar2;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)&__range2);
  std::__cxx11::string::~string((string *)local_110);
  return;
}

Assistant:

Material::Material(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const ShadingModel = sc["ShadingModel"];
    const Element* const MultiLayer = sc["MultiLayer"];

    if(MultiLayer) {
        multilayer = !!ParseTokenAsInt(GetRequiredToken(*MultiLayer,0));
    }

    if(ShadingModel) {
        shading = ParseTokenAsString(GetRequiredToken(*ShadingModel,0));
    }
    else {
        DOMWarning("shading mode not specified, assuming phong",&element);
        shading = "phong";
    }

    std::string templateName;

    // lower-case shading because Blender (for example) writes "Phong"
    std::transform(shading.begin(), shading.end(), shading.begin(), ::tolower);
    if(shading == "phong") {
        templateName = "Material.FbxSurfacePhong";
    }
    else if(shading == "lambert") {
        templateName = "Material.FbxSurfaceLambert";
    }
    else {
        DOMWarning("shading mode not recognized: " + shading,&element);
    }

    props = GetPropertyTable(doc,templateName,element,sc);

    // resolve texture links
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID());
    for(const Connection* con : conns) {

        // texture link to properties, not objects
        if (!con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for texture link, ignoring",&element);
            continue;
        }

        const Texture* const tex = dynamic_cast<const Texture*>(ob);
        if(!tex) {
            const LayeredTexture* const layeredTexture = dynamic_cast<const LayeredTexture*>(ob);
            if(!layeredTexture) {
                DOMWarning("source object for texture link is not a texture or layered texture, ignoring",&element);
                continue;
            }
            const std::string& prop = con->PropertyName();
            if (layeredTextures.find(prop) != layeredTextures.end()) {
                DOMWarning("duplicate layered texture link: " + prop,&element);
            }

            layeredTextures[prop] = layeredTexture;
            ((LayeredTexture*)layeredTexture)->fillTexture(doc);
        }
        else
        {
            const std::string& prop = con->PropertyName();
            if (textures.find(prop) != textures.end()) {
                DOMWarning("duplicate texture link: " + prop,&element);
            }

            textures[prop] = tex;
        }

    }
}